

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampling.cpp
# Opt level: O2

string * common_sampler_prev_str_abi_cxx11_
                   (string *__return_storage_ptr__,common_sampler *gsmpl,llama_context *ctx_main,
                   int n)

{
  uint uVar1;
  int *piVar2;
  ulong i;
  string local_50;
  
  uVar1 = (uint)(gsmpl->prev).sz;
  if ((int)uVar1 < n) {
    n = uVar1;
  }
  if (n < 1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"",(allocator<char> *)&local_50);
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
    i = (ulong)(uint)n;
    while (0 < (long)i) {
      i = i - 1;
      piVar2 = ring_buffer<int>::rat(&gsmpl->prev,i);
      if (*piVar2 == -1) {
        ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/common/sampling.cpp"
                   ,0x1d0,"GGML_ASSERT(%s) failed",
                   "id != LLAMA_TOKEN_NULL && \"null token in the sampling history - should not happen\""
                  );
      }
      common_token_to_piece_abi_cxx11_(&local_50,ctx_main,*piVar2,true);
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      std::__cxx11::string::~string((string *)&local_50);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string common_sampler_prev_str(common_sampler * gsmpl, llama_context * ctx_main, int n) {
    n = std::min(n, (int) gsmpl->prev.size());

    if (n <= 0) {
        return "";
    }

    std::string result;
    result.reserve(8*n); // 8 is the average length of a token [citation needed], TODO: compute this from the vocab

    for (int i = n - 1; i >= 0; i--) {
        const llama_token id = gsmpl->prev.rat(i);

        GGML_ASSERT(id != LLAMA_TOKEN_NULL && "null token in the sampling history - should not happen");

        result += common_token_to_piece(ctx_main, id);
    }

    return result;
}